

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void dump_alcCreateContext
               (CallerInfo *callerinfo,ALCcontext *retval,ALCdevice *device,ALCint *origattrlist,
               uint32 attrcount,ALCint *attrlist)

{
  char *pcVar1;
  char *pcVar2;
  uint local_3c;
  ALCint i;
  ALCint *attrlist_local;
  uint32 attrcount_local;
  ALCint *origattrlist_local;
  ALCdevice *device_local;
  ALCcontext *retval_local;
  CallerInfo *callerinfo_local;
  
  pcVar1 = deviceString(device);
  pcVar2 = ptrString(origattrlist);
  printf("(%s, %s",pcVar1,pcVar2);
  if (origattrlist != (ALCint *)0x0) {
    printf(" {");
    for (local_3c = 0; local_3c < attrcount; local_3c = local_3c + 2) {
      pcVar1 = alcenumString(attrlist[(int)local_3c]);
      printf(" %s, %u,",pcVar1,(ulong)(uint)attrlist[(int)(local_3c + 1)]);
    }
    printf(" 0 }");
  }
  pcVar1 = ctxString(retval);
  printf(") => %s\n",pcVar1);
  return;
}

Assistant:

static void dump_alcCreateContext(CallerInfo *callerinfo, ALCcontext *retval, ALCdevice *device, const ALCint *origattrlist, uint32 attrcount, const ALCint *attrlist)
{
    printf("(%s, %s", deviceString(device), ptrString(origattrlist));
    if (origattrlist) {
        ALCint i;
        printf(" {");
        for (i = 0; i < attrcount; i += 2) {
            printf(" %s, %u,", alcenumString(attrlist[i]), (uint) attrlist[i+1]);
        }
        printf(" 0 }");
    }
    printf(") => %s\n", ctxString(retval));
}